

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::base::LogFormat::~LogFormat(LogFormat *this)

{
  LogFormat *in_RDI;
  
  ~LogFormat(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~LogFormat(void) {}